

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

MSize var_lookup_(FuncState *fs,GCstr *name,ExpDesc *e,int first)

{
  ushort uVar1;
  BCReg level;
  MSize vidx_00;
  MSize MVar2;
  MSize vidx;
  BCReg reg;
  int first_local;
  ExpDesc *e_local;
  GCstr *name_local;
  FuncState *fs_local;
  
  if (fs == (FuncState *)0x0) {
    e->k = VGLOBAL;
    (e->u).s.info = 0;
    e->t = 0xffffffff;
    e->f = 0xffffffff;
    (e->u).sval = name;
  }
  else {
    level = var_lookup_local(fs,name);
    if (-1 < (int)level) {
      e->k = VLOCAL;
      (e->u).s.info = level;
      e->t = 0xffffffff;
      e->f = 0xffffffff;
      if (first == 0) {
        fscope_uvmark(fs,level);
      }
      uVar1 = fs->varmap[level];
      (e->u).s.aux = (uint)uVar1;
      return (uint)uVar1;
    }
    vidx_00 = var_lookup_(fs->prev,name,e,0);
    if (-1 < (int)vidx_00) {
      MVar2 = var_lookup_uv(fs,vidx_00,e);
      (e->u).s.info = MVar2 & 0xff;
      e->k = VUPVAL;
      return vidx_00;
    }
  }
  return 0xffffffff;
}

Assistant:

static MSize var_lookup_(FuncState *fs, GCstr *name, ExpDesc *e, int first)
{
  if (fs) {
    BCReg reg = var_lookup_local(fs, name);
    if ((int32_t)reg >= 0) {  /* Local in this function? */
      expr_init(e, VLOCAL, reg);
      if (!first)
	fscope_uvmark(fs, reg);  /* Scope now has an upvalue. */
      return (MSize)(e->u.s.aux = (uint32_t)fs->varmap[reg]);
    } else {
      MSize vidx = var_lookup_(fs->prev, name, e, 0);  /* Var in outer func? */
      if ((int32_t)vidx >= 0) {  /* Yes, make it an upvalue here. */
	e->u.s.info = (uint8_t)var_lookup_uv(fs, vidx, e);
	e->k = VUPVAL;
	return vidx;
      }
    }
  } else {  /* Not found in any function, must be a global. */
    expr_init(e, VGLOBAL, 0);
    e->u.sval = name;
  }
  return (MSize)-1;  /* Global. */
}